

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int monty_reduce_internal(MontyContext *mc,mp_int *x,mp_int scratch)

{
  ulong uVar1;
  mp_int *b;
  mp_int scratch_00;
  mp_int scratch_01;
  uint yes;
  ulong uVar2;
  ulong uVar3;
  BignumInt *pBVar4;
  ulong uVar5;
  mp_int mVar6;
  mp_int k;
  mp_int mk;
  mp_int x_lo;
  mp_int toret;
  mp_int local_80;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  local_50.w = scratch.w;
  local_50.nw = scratch.nw;
  local_60.w = x->w;
  local_60.nw = mc->rbits;
  if (x->nw < mc->rbits) {
    local_60.nw = x->nw;
  }
  local_80 = mp_alloc_from_scratch(&local_50,mc->rw);
  scratch_00.w = local_50.w;
  scratch_00.nw = local_50.nw;
  mp_mul_internal(&local_80,&local_60,mc->minus_minv_mod_r,scratch_00);
  local_70 = mp_alloc_from_scratch(&local_50,mc->pw);
  pBVar4 = local_70.w;
  uVar2 = local_70.nw;
  scratch_01.w = local_50.w;
  scratch_01.nw = local_50.nw;
  mp_mul_internal(&local_70,mc->m,&local_80,scratch_01);
  mp_add_into_internal(&local_70,x,&local_70);
  uVar1 = mc->rw;
  uVar3 = uVar1;
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  uVar5 = uVar2 - uVar3;
  if (uVar2 - uVar1 <= uVar2 - uVar3) {
    uVar5 = uVar2 - uVar1;
  }
  b = mc->m;
  local_40.nw = uVar5;
  local_40.w = pBVar4 + uVar3;
  yes = mp_cmp_hs(&local_40,b);
  mp_cond_sub_into(&local_40,&local_40,b,yes);
  mVar6.w = pBVar4 + uVar3;
  mVar6.nw = uVar5;
  return mVar6;
}

Assistant:

static mp_int monty_reduce_internal(MontyContext *mc, mp_int *x, mp_int scratch)
{
    /*
     * The trick with Montgomery reduction is that on the one hand we
     * want to reduce the size of the input by a factor of about r,
     * and on the other hand, the two numbers we just multiplied were
     * both stored with an extra factor of r multiplied in. So we
     * computed ar*br = ab r^2, but we want to return abr, so we need
     * to divide by r - and if we can do that by _actually dividing_
     * by r then this also reduces the size of the number.
     *
     * But we can only do that if the number we're dividing by r is a
     * multiple of r. So first we must add an adjustment to it which
     * clears its bottom 'rbits' bits. That adjustment must be a
     * multiple of m in order to leave the residue mod n unchanged, so
     * the question is, what multiple of m can we add to x to make it
     * congruent to 0 mod r? And the answer is, x * (-m)^{-1} mod r.
     */

    /* x mod r */
    mp_int x_lo = mp_make_alias(x, 0, mc->rbits);

    /* x * (-m)^{-1}, i.e. the number we want to multiply by m */
    mp_int k = mp_alloc_from_scratch(&scratch, mc->rw);
    mp_mul_internal(&k, &x_lo, mc->minus_minv_mod_r, scratch);

    /* m times that, i.e. the number we want to add to x */
    mp_int mk = mp_alloc_from_scratch(&scratch, mc->pw);
    mp_mul_internal(&mk, mc->m, &k, scratch);

    /* Add it to x */
    mp_add_into(&mk, x, &mk);

    /* Reduce mod r, by simply making an alias to the upper words of x */
    mp_int toret = mp_make_alias(&mk, mc->rw, mk.nw - mc->rw);

    /*
     * We'll generally be doing this after a multiplication of two
     * fully reduced values. So our input could be anything up to m^2,
     * and then we added up to rm to it. Hence, the maximum value is
     * rm+m^2, and after dividing by r, that becomes r + m(m/r) < 2r.
     * So a single trial-subtraction will finish reducing to the
     * interval [0,m).
     */
    mp_cond_sub_into(&toret, &toret, mc->m, mp_cmp_hs(&toret, mc->m));
    return toret;
}